

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O3

int libwebvtt::Parser::ParseSettings(string *line,size_type idx,settings_t *settings)

{
  char cVar1;
  byte bVar2;
  long lVar3;
  pointer pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_type sVar7;
  Setting local_70;
  
  std::__cxx11::_List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>::_M_clear
            ((_List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_> *)settings);
  *(settings_t **)(settings + 8) = settings;
  *(settings_t **)settings = settings;
  *(undefined8 *)(settings + 0x10) = 0;
  if ((idx == 0xffffffffffffffff) || (line->_M_string_length <= idx)) {
    return -1;
  }
  pcVar4 = (line->_M_dataplus)._M_p;
LAB_0010cbf8:
  paVar6 = &local_70.value.field_2;
  paVar5 = &local_70.name.field_2;
  sVar7 = idx;
  while( true ) {
    sVar7 = sVar7 + 1;
    cVar1 = pcVar4[idx];
    if ((cVar1 != '\t') && (cVar1 != ' ')) break;
    idx = idx + 1;
  }
  if (cVar1 == '\0') {
    return 0;
  }
  local_70.value.field_2._8_8_ = 0;
  local_70.value._M_string_length = 0;
  local_70.name.field_2._M_allocated_capacity = 0;
  local_70.name.field_2._8_8_ = 0;
  local_70.name._M_string_length = 0;
  local_70.value.field_2._M_allocated_capacity = 0;
  local_70.name._M_dataplus._M_p = (pointer)paVar5;
  local_70.value._M_dataplus._M_p = (pointer)paVar6;
  std::__cxx11::list<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>::
  _M_insert<libwebvtt::Setting>(settings,(iterator)settings,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.value._M_dataplus._M_p != paVar6) {
    operator_delete(local_70.value._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.name._M_dataplus._M_p != paVar5) {
    operator_delete(local_70.name._M_dataplus._M_p);
  }
  lVar3 = *(long *)(settings + 8);
  do {
    pcVar4 = (line->_M_dataplus)._M_p;
    bVar2 = pcVar4[idx];
    if (bVar2 < 0x20) {
      if (bVar2 == 0) {
        return -1;
      }
      if (bVar2 == 9) {
        return -1;
      }
    }
    else {
      if (bVar2 == 0x20) {
        return -1;
      }
      if (bVar2 == 0x3a) break;
    }
    std::__cxx11::string::push_back((char)lVar3 + '\x10');
    idx = idx + 1;
    sVar7 = sVar7 + 1;
  } while( true );
  if (*(long *)(lVar3 + 0x18) == 0) {
    return -1;
  }
  do {
    bVar2 = pcVar4[sVar7];
    if (bVar2 < 0x20) {
      if ((bVar2 == 0) || (bVar2 == 9)) break;
    }
    else {
      if (bVar2 == 0x20) break;
      if (bVar2 == 0x3a) {
        return -1;
      }
    }
    std::__cxx11::string::push_back((char)lVar3 + '0');
    pcVar4 = (line->_M_dataplus)._M_p;
    sVar7 = sVar7 + 1;
  } while( true );
  idx = sVar7;
  if (*(long *)(lVar3 + 0x38) == 0) {
    return -1;
  }
  goto LAB_0010cbf8;
}

Assistant:

int Parser::ParseSettings(const std::string& line, std::string::size_type idx,
                          Cue::settings_t* settings) {
  settings->clear();

  if (idx == std::string::npos || idx >= line.length())
    return -1;

  for (;;) {
    // We must parse a line comprising a sequence of 0 or more
    // NAME:VALUE pairs, separated by whitespace.  The line iself is
    // terminated with a NUL char (indicating end-of-line).

    for (;;) {
      const char c = line[idx];

      if (c == kNUL)  // end-of-line
        return 0;  // success

      if (c != kSPACE && c != kTAB)
        break;

      ++idx;  // consume whitespace
    }

    // We have consumed the whitespace, and have not yet reached
    // end-of-line, so there is something on the line for us to parse.

    settings->push_back(Setting());
    Setting& s = settings->back();

    // Parse the NAME part of the settings pair.

    for (;;) {
      const char c = line[idx];

      if (c == ':')  // we have reached end of NAME part
        break;

      if (c == kNUL || c == kSPACE || c == kTAB)
        return -1;

      s.name.push_back(c);

      ++idx;
    }

    if (s.name.empty())
      return -1;

    ++idx;  // consume colon

    // Parse the VALUE part of the settings pair.

    for (;;) {
      const char c = line[idx];

      if (c == kNUL || c == kSPACE || c == kTAB)
        break;

      if (c == ':')  // suspicious when part of VALUE
        return -1;  // TODO(matthewjheaney): verify this behavior

      s.value.push_back(c);

      ++idx;
    }

    if (s.value.empty())
      return -1;
  }
}